

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

PClassActor * __thiscall PClassActor::GetReplacee(PClassActor *this,bool lookskill)

{
  PClass *pPVar1;
  PClassActor *pPVar2;
  undefined7 in_register_00000031;
  FName FVar3;
  PClassActor *pPVar4;
  FName local_54;
  FName local_50;
  FName local_4c;
  FName local_48;
  FName local_44;
  FName local_40;
  FName local_3c;
  int local_38;
  FName local_34;
  
  FVar3.Index = 0;
  if (((int)CONCAT71(in_register_00000031,lookskill) != 0) &&
     (FVar3.Index = 0, (uint)gameskill.Value < AllSkills.Count)) {
    local_38 = (this->super_PClass).super_PStruct.super_PNamedType.TypeName.Index;
    FSkillInfo::GetReplacedBy
              ((FSkillInfo *)&stack0xffffffffffffffcc,&AllSkills.Array[gameskill.Value].Name);
    if ((long)local_34.Index != 0) {
      local_3c.Index = local_34.Index;
      pPVar1 = PClass::FindClass(&local_3c);
      FVar3.Index = local_34.Index;
      if (pPVar1 == (PClass *)0x0) {
        Printf("Warning: incorrect actor name in definition of skill %s: \nnon-existent class %s is replaced by class %s\nSkill replacement will be ignored for this actor.\n"
               ,FName::NameData.NameArray[AllSkills.Array[gameskill.Value].Name.Index].Text,
               FName::NameData.NameArray[local_34.Index].Text,
               FName::NameData.NameArray
               [(this->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
        local_40.Index = (this->super_PClass).super_PStruct.super_PNamedType.TypeName.Index;
        local_44.Index = 0;
        FSkillInfo::SetReplacedBy(AllSkills.Array + gameskill.Value,&local_40,&local_44);
        local_48.Index = local_34.Index;
        local_4c.Index = 0;
        FSkillInfo::SetReplacement(AllSkills.Array + gameskill.Value,&local_48,&local_4c);
        pPVar4 = this->Replacee;
        if (pPVar4 == (PClassActor *)0x0) {
          return this;
        }
        this->Replacee = (PClassActor *)0x0;
        pPVar2 = pPVar4;
        goto LAB_00467bbb;
      }
    }
  }
  pPVar4 = this->Replacee;
  pPVar2 = pPVar4;
  if (pPVar4 == (PClassActor *)0x0) {
    if (!lookskill || FVar3.Index == 0) {
      return this;
    }
    this->Replacee = (PClassActor *)0x0;
  }
  else {
    this->Replacee = (PClassActor *)0x0;
    if (!lookskill || FVar3.Index == 0) goto LAB_00467bbb;
  }
  local_50.Index = FVar3.Index;
  pPVar1 = PClass::FindClass(&local_50);
  if (pPVar1 != (PClass *)0x0) {
    local_54.Index = FVar3.Index;
    pPVar2 = PClass::FindActor(&local_54);
  }
LAB_00467bbb:
  pPVar2 = GetReplacee(pPVar2,false);
  this->Replacee = pPVar4;
  return pPVar2;
}

Assistant:

PClassActor *PClassActor::GetReplacee(bool lookskill)
{
	FName skillrepname;
	
	if (lookskill && AllSkills.Size() > (unsigned)gameskill)
	{
		skillrepname = AllSkills[gameskill].GetReplacedBy(TypeName);
		if (skillrepname != NAME_None && PClass::FindClass(skillrepname) == NULL)
		{
			Printf("Warning: incorrect actor name in definition of skill %s: \n"
				   "non-existent class %s is replaced by class %s\n"
				   "Skill replacement will be ignored for this actor.\n", 
				   AllSkills[gameskill].Name.GetChars(), 
				   skillrepname.GetChars(), TypeName.GetChars());
			AllSkills[gameskill].SetReplacedBy(TypeName, NAME_None);
			AllSkills[gameskill].SetReplacement(skillrepname, NAME_None);
			lookskill = false; 
		}
	}
	if (Replacee == NULL && (!lookskill || skillrepname == NAME_None))
	{
		return this;
	}
	// The Replacee field is temporarily NULLed to prevent
	// potential infinite recursion.
	PClassActor *savedrep = Replacee;
	Replacee = NULL;
	PClassActor *rep = savedrep;
	if (lookskill && (skillrepname != NAME_None) && (PClass::FindClass(skillrepname) != NULL))
	{
		rep = PClass::FindActor(skillrepname);
	}
	rep = rep->GetReplacee(false);
	Replacee = savedrep;
	return rep;
}